

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shqput.c
# Opt level: O0

int main(void)

{
  QcShmQue *shmQue_00;
  size_t sVar1;
  char *msg;
  QcShmQue *shmQue;
  int msglen;
  int bufflen;
  char *buff;
  int idx;
  QcErr err;
  int ret;
  
  err.desc[0xfc] = '\0';
  err.desc[0xfd] = '\0';
  err.desc[0xfe] = '\0';
  err.desc[0xff] = '\0';
  shmQue_00 = qc_shqueue_attach("shm_1","queue_2",(QcErr *)((long)&buff + 4));
  if (shmQue_00 == (QcShmQue *)0x0) {
    printf("qc_shqueue_attach failed, err=%s.\n",&idx);
    exit(-1);
  }
  err.desc._248_4_ =
       qc_shqueue_push_begin
                 (shmQue_00,(int *)&buff,(char **)&msglen,(int *)((long)&shmQue + 4),
                  (QcErr *)((long)&buff + 4));
  if ((int)err.desc._248_4_ < 0) {
    printf("qc_shqueue_push_begin failed, err=%s.\n",&idx);
    exit(-1);
  }
  sVar1 = strlen("hello world!");
  shmQue._0_4_ = (uint)sVar1;
  strncpy(_msglen,"hello world!",(long)(int)(uint)shmQue);
  err.desc._248_4_ =
       qc_shqueue_push_end(shmQue_00,(int)buff,(uint)shmQue,(QcErr *)((long)&buff + 4));
  if ((int)err.desc._248_4_ < 0) {
    printf("qc_shqueue_push_end failed, err=%s.\n",&idx);
    exit(-1);
  }
  printf("put message succeed, len=%d.\n",(ulong)(uint)shmQue);
  qc_shqueue_deattach(shmQue_00);
  exit(0);
}

Assistant:

int main()
{
    int ret;
    QcErr err;
    int idx;
    char* buff;
    int bufflen, msglen;
    QcShmQue *shmQue;
    char *msg = "hello world!";
    
    shmQue = qc_shqueue_attach("shm_1", "queue_2", &err);
    if(NULL == shmQue)
    {
        printf("qc_shqueue_attach failed, err=%s.\n", err.desc);
        exit(-1);
    }


    ret = qc_shqueue_push_begin(shmQue, &idx, &buff, &bufflen, &err);
    if(ret < 0)
    {
        printf("qc_shqueue_push_begin failed, err=%s.\n", err.desc);
        exit(-1);
    }

    msglen = strlen(msg);
    strncpy(buff, msg, msglen);

    ret = qc_shqueue_push_end(shmQue, idx, msglen, &err);
    if (ret < 0)
    {
        printf("qc_shqueue_push_end failed, err=%s.\n", err.desc);
        exit(-1);
    }

    printf("put message succeed, len=%d.\n", msglen);

    qc_shqueue_deattach(shmQue);

    exit(0);
}